

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

TestCaseGroup * vkt::image::createImageStoreTests(TestContext *testCtx)

{
  uint *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  TestNode *node;
  long lVar4;
  TestNode *pTVar5;
  long *plVar6;
  size_type *psVar7;
  ImageType imageType;
  ImageType imageType_00;
  VkFormat format;
  VkFormat format_00;
  VkFormat format_01;
  long lVar8;
  string local_d0;
  TestNode *local_b0;
  TestNode *local_a8;
  TestContext *local_a0;
  TestNode *local_98;
  string local_90;
  TestNode *local_70;
  TestNode *local_68;
  long local_60;
  int local_54;
  long *local_50 [2];
  long local_40 [2];
  
  local_68 = (TestNode *)operator_new(0x70);
  local_a0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_68,testCtx,"store","Plain imageStore() cases");
  local_70 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,local_a0,"with_format",
             "Declare a format layout qualifier for write images");
  local_a8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a8,local_a0,"without_format",
             "Do not declare a format layout qualifier for write images");
  local_60 = 0;
  do {
    local_b0 = (TestNode *)operator_new(0x70);
    lVar4 = local_60;
    lVar8 = local_60 * 0x18;
    puVar2 = &(anonymous_namespace)::s_textures + local_60 * 3;
    getImageTypeName_abi_cxx11_
              (&local_d0,(image *)(ulong)*(uint *)(&DAT_00da5fec + local_60 * 3),imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_b0,local_a0,local_d0._M_dataplus._M_p,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_98 = (TestNode *)operator_new(0x70);
    puVar1 = (uint *)(&DAT_00da5fec + lVar4 * 3);
    getImageTypeName_abi_cxx11_(&local_d0,(image *)(ulong)*puVar1,imageType_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_98,local_a0,local_d0._M_dataplus._M_p,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_54 = *(int *)((long)&DAT_00da5fec + lVar8 + 4);
    lVar8 = 0;
    do {
      pTVar5 = (TestNode *)operator_new(0x90);
      uVar3 = *(uint *)((long)&(anonymous_namespace)::s_formats + lVar8);
      getFormatShortString_abi_cxx11_(&local_d0,(image *)(ulong)uVar3,format);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,local_a0,local_d0._M_dataplus._M_p,local_90._M_dataplus._M_p);
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d62158;
      pTVar5[1]._vptr_TestNode = (_func_int **)*puVar2;
      *(undefined4 *)&pTVar5[1].m_testCtx = (&DAT_00da5fe8)[lVar4 * 6];
      *(undefined8 *)((long)&pTVar5[1].m_testCtx + 4) = *(undefined8 *)puVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = (&DAT_00da5ff4)[lVar4 * 6];
      *(uint *)&pTVar5[1].m_name._M_string_length = uVar3;
      *(undefined2 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 1;
      tcu::TestNode::addChild(local_b0,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = (TestNode *)operator_new(0x90);
      getFormatShortString_abi_cxx11_(&local_d0,(image *)(ulong)uVar3,format_00);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,local_a0,local_d0._M_dataplus._M_p,local_90._M_dataplus._M_p);
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d62158;
      pTVar5[1]._vptr_TestNode = (_func_int **)*puVar2;
      *(undefined4 *)&pTVar5[1].m_testCtx = (&DAT_00da5fe8)[lVar4 * 6];
      *(undefined8 *)((long)&pTVar5[1].m_testCtx + 4) = *(undefined8 *)puVar1;
      *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = (&DAT_00da5ff4)[lVar4 * 6];
      *(uint *)&pTVar5[1].m_name._M_string_length = uVar3;
      *(undefined2 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0;
      tcu::TestNode::addChild(local_98,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (1 < local_54) {
        pTVar5 = (TestNode *)operator_new(0x90);
        getFormatShortString_abi_cxx11_(&local_90,(image *)(ulong)uVar3,format_01);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0.field_2._8_4_ = (undefined4)plVar6[3];
          local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,local_a0,local_d0._M_dataplus._M_p,(char *)local_50[0]);
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d62158;
        pTVar5[1]._vptr_TestNode = (_func_int **)*puVar2;
        *(undefined4 *)&pTVar5[1].m_testCtx = (&DAT_00da5fe8)[lVar4 * 6];
        *(undefined8 *)((long)&pTVar5[1].m_testCtx + 4) = *(undefined8 *)puVar1;
        *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = (&DAT_00da5ff4)[lVar4 * 6];
        *(uint *)&pTVar5[1].m_name._M_string_length = uVar3;
        *(undefined2 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x101;
        tcu::TestNode::addChild(local_b0,pTVar5);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x34);
    tcu::TestNode::addChild(local_70,local_b0);
    pTVar5 = local_98;
    local_98 = (TestNode *)0x0;
    tcu::TestNode::addChild(local_a8,pTVar5);
    pTVar5 = local_68;
    local_60 = local_60 + 1;
  } while (local_60 != 8);
  tcu::TestNode::addChild(local_68,local_70);
  node = local_a8;
  local_a8 = (TestNode *)0x0;
  tcu::TestNode::addChild(pTVar5,node);
  return (TestCaseGroup *)pTVar5;
}

Assistant:

tcu::TestCaseGroup* createImageStoreTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "store", "Plain imageStore() cases"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithFormat(new tcu::TestCaseGroup(testCtx, "with_format", "Declare a format layout qualifier for write images"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithoutFormat(new tcu::TestCaseGroup(testCtx, "without_format", "Do not declare a format layout qualifier for write images"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupWithFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		de::MovePtr<tcu::TestCaseGroup> groupWithoutFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		const bool isLayered = (texture.numLayers() > 1);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			groupWithFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx]));
			groupWithoutFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx], 0));

			if (isLayered)
				groupWithFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]) + "_single_layer", "",
														texture, s_formats[formatNdx],
														StoreTest::FLAG_SINGLE_LAYER_BIND | StoreTest::FLAG_DECLARE_IMAGE_FORMAT_IN_SHADER));
		}

		testGroupWithFormat->addChild(groupWithFormatByImageViewType.release());
		testGroupWithoutFormat->addChild(groupWithoutFormatByImageViewType.release());
	}

	testGroup->addChild(testGroupWithFormat.release());
	testGroup->addChild(testGroupWithoutFormat.release());

	return testGroup.release();
}